

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

CURLcode mqtt_verify_connack(Curl_easy *data)

{
  void *pvVar1;
  char *ptr_00;
  char *ptr;
  CURLcode result;
  MQTT *mq;
  Curl_easy *data_local;
  
  pvVar1 = Curl_meta_get(data,"meta:proto:mqtt:easy");
  if (pvVar1 == (void *)0x0) {
    data_local._4_4_ = CURLE_FAILED_INIT;
  }
  else {
    ptr._4_4_ = mqtt_recv_atleast(data,2);
    if (ptr._4_4_ == CURLE_OK) {
      ptr_00 = Curl_dyn_ptr((dynbuf *)((long)pvVar1 + 0x20));
      Curl_debug(data,CURLINFO_HEADER_IN,ptr_00,2);
      if ((*ptr_00 == '\0') && (ptr_00[1] == '\0')) {
        mqtt_recv_consume(data,2);
      }
      else {
        Curl_failf(data,"Expected %02x%02x but got %02x%02x",0,0,(ulong)(uint)(int)*ptr_00,
                   (ulong)(uint)(int)ptr_00[1]);
        Curl_dyn_reset((dynbuf *)((long)pvVar1 + 0x20));
        ptr._4_4_ = CURLE_WEIRD_SERVER_REPLY;
      }
    }
    data_local._4_4_ = ptr._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode mqtt_verify_connack(struct Curl_easy *data)
{
  struct MQTT *mq = Curl_meta_get(data, CURL_META_MQTT_EASY);
  CURLcode result;
  char *ptr;

  DEBUGASSERT(mq);
  if(!mq)
    return CURLE_FAILED_INIT;

  result = mqtt_recv_atleast(data, MQTT_CONNACK_LEN);
  if(result)
    goto fail;

  /* verify CONNACK */
  DEBUGASSERT(Curl_dyn_len(&mq->recvbuf) >= MQTT_CONNACK_LEN);
  ptr = Curl_dyn_ptr(&mq->recvbuf);
  Curl_debug(data, CURLINFO_HEADER_IN, ptr, MQTT_CONNACK_LEN);

  if(ptr[0] != 0x00 || ptr[1] != 0x00) {
    failf(data, "Expected %02x%02x but got %02x%02x",
          0x00, 0x00, ptr[0], ptr[1]);
    Curl_dyn_reset(&mq->recvbuf);
    result = CURLE_WEIRD_SERVER_REPLY;
    goto fail;
  }
  mqtt_recv_consume(data, MQTT_CONNACK_LEN);
fail:
  return result;
}